

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::resize(QByteArray *this,qsizetype size)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  long lVar4;
  char *pcVar5;
  QByteArray *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  qsizetype capacityAtEnd;
  qsizetype in_stack_00000028;
  QArrayDataPointer<char> *in_stack_ffffffffffffffe8;
  
  if ((long)in_RSI < 0) {
    in_RSI = (QByteArray *)0x0;
  }
  qVar2 = capacity((QByteArray *)0x141fe7);
  qVar3 = QArrayDataPointer<char>::freeSpaceAtBegin(in_stack_ffffffffffffffe8);
  lVar4 = qVar2 - qVar3;
  QArrayDataPointer<char>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<char>::needsDetach(in_RDI);
  if ((bVar1) || (lVar4 < (long)in_RSI)) {
    reallocData(in_RSI,in_stack_00000028,(AllocationOption)((ulong)lVar4 >> 0x20));
  }
  in_RDI->size = (qsizetype)in_RSI;
  QArrayDataPointer<char>::operator->(in_RDI);
  qVar2 = QArrayDataPointer<char>::allocatedCapacity(in_RDI);
  if (qVar2 != 0) {
    pcVar5 = QArrayDataPointer<char>::data(in_RDI);
    pcVar5[(long)in_RSI] = '\0';
  }
  return;
}

Assistant:

void QByteArray::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    const auto capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (d->needsDetach() || size > capacityAtEnd)
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = 0;
}